

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3PutColNumber(char **pp,int iCol)

{
  char *pcVar1;
  int iVar2;
  char *p;
  int n;
  int iCol_local;
  char **pp_local;
  
  p._0_4_ = 0;
  if (iCol != 0) {
    pcVar1 = *pp;
    iVar2 = sqlite3Fts3PutVarint(pcVar1 + 1,(long)iCol);
    p._0_4_ = iVar2 + 1;
    *pcVar1 = '\x01';
    *pp = pcVar1 + (int)p;
  }
  return (int)p;
}

Assistant:

static int fts3PutColNumber(char **pp, int iCol){
  int n = 0;                      /* Number of bytes written */
  if( iCol ){
    char *p = *pp;                /* Output pointer */
    n = 1 + sqlite3Fts3PutVarint(&p[1], iCol);
    *p = 0x01;
    *pp = &p[n];
  }
  return n;
}